

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O1

size_t __thiscall
PEFile::getExportsMap(PEFile *this,QMap<unsigned_long,_QString> *entrypoints,addr_type aType)

{
  QMapData<std::map<unsigned_long,_QString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QString>_>_>_>
  *pQVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  long lVar4;
  long lVar5;
  ExportEntryWrapper *this_00;
  offset_t oVar6;
  undefined4 extraout_var_00;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  offset_t offset;
  QString forwarder;
  QString local_68;
  key_type local_50;
  QString local_48;
  
  pQVar1 = (entrypoints->d).d;
  if (pQVar1 == (QMapData<std::map<unsigned_long,_QString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QString>_>_>_>
                 *)0x0) {
    sVar8 = 0;
  }
  else {
    sVar8 = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  iVar2 = (*(this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer[2])
                    (&(this->super_MappedExe).super_ExeWrappersContainer,6);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar2),&ExeElementWrapper::typeinfo,
                                    &ExportDirWrapper::typeinfo,0);
  }
  if ((plVar3 != (long *)0x0) && (lVar4 = (**(code **)(*plVar3 + 0x108))(plVar3), lVar4 != 0)) {
    lVar9 = 0;
    do {
      lVar5 = (**(code **)(*plVar3 + 0x100))(plVar3,lVar9);
      if (lVar5 == 0) {
        this_00 = (ExportEntryWrapper *)0x0;
      }
      else {
        this_00 = (ExportEntryWrapper *)
                  __dynamic_cast(lVar5,&ExeNodeWrapper::typeinfo,&ExportEntryWrapper::typeinfo,0);
      }
      if (this_00 != (ExportEntryWrapper *)0x0) {
        ExportEntryWrapper::getForwarderStr(&local_48,this_00);
        if (local_48.d.size == 0) {
          oVar6 = ExportEntryWrapper::getFuncRva(this_00);
          iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                    _vptr_AbstractByteBuffer[0x17])(this,oVar6,2);
          local_50 = CONCAT44(extraout_var_00,iVar2);
          if (local_50 != 0xffffffffffffffff) {
            (*(this_00->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0xe])(&local_68,this_00);
            QMap<unsigned_long,_QString>::detach(entrypoints);
            std::
            map<unsigned_long,QString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QString>>>
            ::insert_or_assign<QString_const&>
                      ((map<unsigned_long,QString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QString>>>
                        *)&((entrypoints->d).d)->m,&local_50,&local_68);
            if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
              }
            }
          }
        }
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
          }
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar4 != lVar9);
    pQVar1 = (entrypoints->d).d;
    if (pQVar1 == (QMapData<std::map<unsigned_long,_QString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QString>_>_>_>
                   *)0x0) {
      sVar7 = 0;
    }
    else {
      sVar7 = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    return sVar7 - sVar8;
  }
  return 0;
}

Assistant:

size_t PEFile::getExportsMap(QMap<offset_t,QString> &entrypoints, Executable::addr_type aType)
{
    size_t initialSize = entrypoints.size();

    ExportDirWrapper* exports = dynamic_cast<ExportDirWrapper*>(this->getWrapper(PEFile::WR_DIR_ENTRY + pe::DIR_EXPORT));
    if (!exports) return 0;
        
    const size_t entriesCnt = exports->getEntriesCount();
    if (entriesCnt == 0) return 0;

    for (int i = 0; i < entriesCnt; i++) {
        ExportEntryWrapper* entry = dynamic_cast<ExportEntryWrapper*>(exports->getEntryAt(i));
        if (!entry) continue;

        QString forwarder = entry->getForwarderStr();
        if (forwarder.length()) {
            continue;
        }
        offset_t rva = entry->getFuncRva();
        offset_t offset = this->convertAddr(rva, Executable::RVA, aType);
        if (offset == INVALID_ADDR) {
            continue;
        }
        entrypoints.insert(offset, entry->getName());
    }
    return entrypoints.size() - initialSize;
}